

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void labeltype_cb(Fl_Choice *i,void *v)

{
  bool bVar1;
  Fl_Labeltype FVar2;
  int iVar3;
  long lVar4;
  Fl_Widget_Type *p;
  Fl_Type *o;
  int n_1;
  int m;
  int mod;
  int j;
  int n;
  void *v_local;
  Fl_Choice *i_local;
  
  if ((char *)v == "LOAD") {
    FVar2 = Fl_Widget::labeltype(current_widget->o);
    Fl_Widget::when((Fl_Widget *)i,'\x04');
    for (m = 0; m < 6; m = m + 1) {
      lVar4 = Fl_Menu_Item::argument(labeltypemenu + m);
      if (lVar4 == (int)FVar2) {
        Fl_Choice::value(i,m);
        return;
      }
    }
  }
  else {
    bVar1 = false;
    iVar3 = Fl_Choice::value(i);
    lVar4 = Fl_Menu_Item::argument(labeltypemenu + iVar3);
    if (-1 < (int)(Fl_Labeltype)lVar4) {
      for (p = (Fl_Widget_Type *)Fl_Type::first; p != (Fl_Widget_Type *)0x0;
          p = (Fl_Widget_Type *)(p->super_Fl_Type).next) {
        if (((p->super_Fl_Type).selected != '\0') &&
           (iVar3 = (*(p->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar3 != 0)) {
          Fl_Widget::labeltype(p->o,(Fl_Labeltype)lVar4);
          Fl_Widget_Type::redraw(p);
          bVar1 = true;
        }
      }
      if (bVar1) {
        set_modflag(1);
      }
    }
  }
  return;
}

Assistant:

void labeltype_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    int n;
    n = current_widget->o->labeltype();
    i->when(FL_WHEN_RELEASE);
    for (int j = 0; j < int(sizeof(labeltypemenu)/sizeof(*labeltypemenu)); j++)
      if (labeltypemenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(labeltypemenu[m].argument());
    if (n<0) return; // should not happen
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* p = (Fl_Widget_Type*)o;
	p->o->labeltype((Fl_Labeltype)n);
	p->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}